

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSW.cpp
# Opt level: O3

void __thiscall Storage::Tape::CSW::CSW(CSW *this,string *file_name)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  long lVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  uint8_t uVar5;
  byte bVar6;
  uint16_t uVar7;
  uint32_t uVar8;
  stat *psVar9;
  undefined7 extraout_var;
  long lVar10;
  undefined4 *puVar11;
  uint uVar12;
  size_t __nbytes;
  void *__buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  uLongf output_length;
  FileHolder file;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_138;
  size_type local_118;
  FileHolder local_110;
  
  (this->super_Tape).pulse_.length.length = 0;
  (this->super_Tape).pulse_.length.clock_rate = 1;
  (this->super_Tape)._vptr_Tape = (_func_int **)&PTR_is_at_end_005a3388;
  *(undefined8 *)&this->field_0x20 = 0x100000000;
  this_00 = &this->source_data_;
  (this->source_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->source_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->source_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->source_data_pointer_ = 0;
  FileHolder::FileHolder(&local_110,file_name,ReadWrite);
  psVar9 = FileHolder::stats(&local_110);
  if (psVar9->st_size < 0x20) {
LAB_0044bc00:
    puVar11 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar11 = 0;
    __cxa_throw(puVar11,&{unnamed_type#1}::typeinfo,0);
  }
  bVar4 = FileHolder::check_signature(&local_110,"Compressed Square Wave",0);
  if (!bVar4) goto LAB_0044bc00;
  uVar5 = FileHolder::get8(&local_110);
  if (uVar5 != '\x1a') goto LAB_0044bc00;
  uVar5 = FileHolder::get8(&local_110);
  bVar6 = FileHolder::get8(&local_110);
  uVar12 = (int)CONCAT71(extraout_var,uVar5) - 3;
  __nbytes = (size_t)uVar12;
  if (((byte)uVar12 < 0xfe) || (1 < bVar6)) {
    puVar11 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar11 = 0;
    __cxa_throw(puVar11,&{unnamed_type#1}::typeinfo,0);
  }
  if (uVar5 == '\x01') {
    uVar7 = FileHolder::get16le(&local_110);
    *(uint *)&this->field_0x24 = (uint)uVar7;
    uVar5 = FileHolder::get8(&local_110);
    if (uVar5 != '\x01') {
LAB_0044bc44:
      puVar11 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar11 = 0;
      __cxa_throw(puVar11,&{unnamed_type#1}::typeinfo,0);
    }
    this->compression_type_ = RLE;
    bVar6 = FileHolder::get8(&local_110);
    *(uint *)&(this->super_Tape).field_0x1c = (uint)(~bVar6 & 1);
    uVar8 = 0;
    FileHolder::seek(&local_110,0x20,0);
  }
  else {
    uVar8 = FileHolder::get32le(&local_110);
    *(uint32_t *)&this->field_0x24 = uVar8;
    uVar8 = FileHolder::get32le(&local_110);
    uVar5 = FileHolder::get8(&local_110);
    __nbytes = 0;
    if (uVar5 != '\x01') {
      if (uVar5 != '\x02') goto LAB_0044bc44;
      __nbytes = 1;
    }
    this->compression_type_ = (CompressionType)__nbytes;
    bVar6 = FileHolder::get8(&local_110);
    *(uint *)&(this->super_Tape).field_0x1c = (uint)(~bVar6 & 1);
    bVar6 = FileHolder::get8(&local_110);
    psVar9 = FileHolder::stats(&local_110);
    if (psVar9->st_size < (long)((ulong)bVar6 + 0x34)) {
      puVar11 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar11 = 0;
      __cxa_throw(puVar11,&{unnamed_type#1}::typeinfo,0);
    }
    FileHolder::seek(&local_110,(ulong)bVar6 + 0x34,0);
  }
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar9 = FileHolder::stats(&local_110);
  lVar1 = psVar9->st_size;
  lVar10 = FileHolder::tell(&local_110);
  __buf = (void *)(lVar1 - lVar10);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_138,(size_type)__buf);
  FileHolder::read(&local_110,
                   (int)local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,__buf,__nbytes);
  if (this->compression_type_ == ZRLE) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,(ulong)uVar8 * 5);
    local_118 = (size_type)(uVar8 * 5);
    uncompress((this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start,&local_118,
               local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
               (long)local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,local_118);
  }
  else {
    puVar2 = (this->source_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar3 = (this->source_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->source_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->source_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->source_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar2 == (pointer)0x0) {
      *(uint *)&(this->super_Tape).field_0x1c = (uint)(*(int *)&(this->super_Tape).field_0x1c == 0);
      goto LAB_0044bbe6;
    }
    operator_delete(puVar2,(long)puVar3 - (long)puVar2);
  }
  *(uint *)&(this->super_Tape).field_0x1c = (uint)(*(int *)&(this->super_Tape).field_0x1c == 0);
  if (local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_138.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_0044bbe6:
  FileHolder::~FileHolder(&local_110);
  return;
}

Assistant:

CSW::CSW(const std::string &file_name) :
	source_data_pointer_(0) {
	Storage::FileHolder file(file_name);
	if(file.stats().st_size < 0x20) throw ErrorNotCSW;

	// Check signature.
	if(!file.check_signature("Compressed Square Wave")) {
		throw ErrorNotCSW;
	}

	// Check terminating byte.
	if(file.get8() != 0x1a) throw ErrorNotCSW;

	// Get version file number.
	uint8_t major_version = file.get8();
	uint8_t minor_version = file.get8();

	// Reject if this is an unknown version.
	if(major_version > 2 || !major_version || minor_version > 1) throw ErrorNotCSW;

	// The header now diverges based on version.
	uint32_t number_of_waves = 0;
	if(major_version == 1) {
		pulse_.length.clock_rate = file.get16le();

		if(file.get8() != 1) throw ErrorNotCSW;
		compression_type_ = CompressionType::RLE;

		pulse_.type = (file.get8() & 1) ? Pulse::High : Pulse::Low;

		file.seek(0x20, SEEK_SET);
	} else {
		pulse_.length.clock_rate = file.get32le();
		number_of_waves = file.get32le();
		switch(file.get8()) {
			case 1: compression_type_ = CompressionType::RLE;	break;
			case 2: compression_type_ = CompressionType::ZRLE;	break;
			default: throw ErrorNotCSW;
		}

		pulse_.type = (file.get8() & 1) ? Pulse::High : Pulse::Low;
		uint8_t extension_length = file.get8();

		if(file.stats().st_size < 0x34 + extension_length) throw ErrorNotCSW;
		file.seek(0x34 + extension_length, SEEK_SET);
	}

	// Grab all data remaining in the file.
	std::vector<uint8_t> file_data;
	std::size_t remaining_data = size_t(file.stats().st_size) - size_t(file.tell());
	file_data.resize(remaining_data);
	file.read(file_data.data(), remaining_data);

	if(compression_type_ == CompressionType::ZRLE) {
		// The only clue given by CSW as to the output size in bytes is that there will be
		// number_of_waves waves. Waves are usually one byte, but may be five. So this code
		// is pessimistic.
		source_data_.resize(size_t(number_of_waves) * 5);

		// uncompress will tell how many compressed bytes there actually were, so use its
		// modification of output_length to throw away all the memory that isn't actually
		// needed.
		uLongf output_length = uLongf(number_of_waves * 5);
		uncompress(source_data_.data(), &output_length, file_data.data(), file_data.size());
		source_data_.resize(std::size_t(output_length));
	} else {
		source_data_ = std::move(file_data);
	}

	invert_pulse();
}